

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O0

bool __thiscall Hospital::Last_Name_Validate(Hospital *this,string *Last_Name)

{
  bool bVar1;
  ostream *this_00;
  string *this_01;
  string Last_Name_1;
  string local_40 [32];
  string *local_20;
  string *Last_Name_local;
  Hospital *this_local;
  
  local_20 = Last_Name;
  Last_Name_local = &this->Admin_Username;
  std::__cxx11::string::string(local_40,(string *)Last_Name);
  bVar1 = validate_String_Must_Be_character(this,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_01 = (string *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string(this_01,(string *)Last_Name);
    __cxa_throw(this_01,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  this_00 = std::operator<<((ostream *)&std::cout,
                            "Your Last_Name must consist of numbers character !");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return false;
}

Assistant:

bool Hospital :: Last_Name_Validate(string Last_Name){
    try {
        if(!validate_String_Must_Be_character(Last_Name)) {
            cout <<"Your Last_Name must consist of numbers character !"<<endl;
            return false;
        }
        else throw Last_Name;
    }
    catch(string Last_Name) {
        cout << "your Last_Name entered successfully ."<<endl;
        return true;
    }
}